

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

void __thiscall
xatlas::internal::
HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
::add(HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
      *this,Vector2 *key)

{
  uint32_t uVar1;
  
  if (this->m_slots == (uint32_t *)0x0) {
    alloc(this);
  }
  uVar1 = computeHash(this,key);
  ArrayBase::push_back(&(this->m_keys).m_base,(uint8_t *)key);
  ArrayBase::push_back(&(this->m_next).m_base,(uint8_t *)(this->m_slots + uVar1));
  this->m_slots[uVar1] = (this->m_next).m_base.size - 1;
  return;
}

Assistant:

void add(const Key &key)
	{
		if (!m_slots)
			alloc();
		const uint32_t hash = computeHash(key);
		m_keys.push_back(key);
		m_next.push_back(m_slots[hash]);
		m_slots[hash] = m_next.size() - 1;
	}